

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Journal.h
# Opt level: O0

ostream * __thiscall
beast::Journal::ScopedStream::operator<<(ScopedStream *this,base_uint<256UL,_void> *t)

{
  base_uint<256UL,_void> *t_local;
  ScopedStream *this_local;
  
  jbcoin::operator<<((ostream *)&this->m_ostream,t);
  return (ostream *)&this->m_ostream;
}

Assistant:

std::ostream&
Journal::ScopedStream::operator<< (T const& t) const
{
    m_ostream << t;
    return m_ostream;
}